

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalCreateMutex
                    (CPalThread *pthr,LPSECURITY_ATTRIBUTES lpMutexAttributes,BOOL bInitialOwner,
                    LPCWSTR lpName,HANDLE *phMutex)

{
  long *local_68;
  ISynchStateController *pssc;
  IPalObject *pobjRegisteredMutex;
  IPalObject *pobjMutex;
  undefined1 local_48 [4];
  PAL_ERROR palError;
  CObjectAttributes oa;
  HANDLE *phMutex_local;
  LPCWSTR lpName_local;
  BOOL bInitialOwner_local;
  LPSECURITY_ATTRIBUTES lpMutexAttributes_local;
  CPalThread *pthr_local;
  
  oa.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)phMutex;
  CObjectAttributes::CObjectAttributes((CObjectAttributes *)local_48,lpName,lpMutexAttributes);
  pobjMutex._4_4_ = 0;
  pobjRegisteredMutex = (IPalObject *)0x0;
  pssc = (ISynchStateController *)0x0;
  local_68 = (long *)0x0;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateMutex",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/mutex.cpp"
            ,0xcb);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (oa.pSecurityAttributes == (LPSECURITY_ATTRIBUTES)0x0) {
    fprintf(_stderr,"] %s %s:%d","InternalCreateMutex",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/mutex.cpp"
            ,0xcc);
    fprintf(_stderr,"Expression: NULL != phMutex\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  if (lpName == (LPCWSTR)0x0) {
    pobjMutex._4_4_ =
         (**(code **)*g_pObjectManager)(g_pObjectManager,pthr,otMutex,local_48,&pobjRegisteredMutex)
    ;
    if (pobjMutex._4_4_ == 0) {
      pobjMutex._4_4_ =
           (*pobjRegisteredMutex->_vptr_IPalObject[5])(pobjRegisteredMutex,pthr,&local_68);
      if (pobjMutex._4_4_ == 0) {
        if (bInitialOwner == 0) {
          pobjMutex._4_4_ = (**(code **)(*local_68 + 8))(local_68,1);
        }
        else {
          pobjMutex._4_4_ = (**(code **)(*local_68 + 0x20))(local_68,pthr);
        }
        (**(code **)(*local_68 + 0x30))();
        if (pobjMutex._4_4_ == 0) {
          pobjMutex._4_4_ =
               (**(code **)(*g_pObjectManager + 8))
                         (g_pObjectManager,pthr,pobjRegisteredMutex,&aotMutex,0,
                          oa.pSecurityAttributes,&pssc);
          pobjRegisteredMutex = (IPalObject *)0x0;
        }
        else {
          fprintf(_stderr,"] %s %s:%d","InternalCreateMutex",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/mutex.cpp"
                  ,0x102);
          fprintf(_stderr,"Unable to set initial mutex state (%d)\n",(ulong)pobjMutex._4_4_);
        }
      }
      else {
        fprintf(_stderr,"] %s %s:%d","InternalCreateMutex",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/mutex.cpp"
                ,0xf1);
        fprintf(_stderr,"Unable to create state controller (%d)\n",(ulong)pobjMutex._4_4_);
      }
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","InternalCreateMutex",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/mutex.cpp"
            ,0xd9);
    fprintf(_stderr,"lpName: Cross-process named objects are not supported in PAL");
    pobjMutex._4_4_ = 0x32;
  }
  if (pobjRegisteredMutex != (IPalObject *)0x0) {
    (*pobjRegisteredMutex->_vptr_IPalObject[8])(pobjRegisteredMutex,pthr);
  }
  if (pssc != (ISynchStateController *)0x0) {
    (*pssc->_vptr_ISynchStateController[8])(pssc,pthr);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return pobjMutex._4_4_;
  }
  abort();
}

Assistant:

PAL_ERROR
CorUnix::InternalCreateMutex(
    CPalThread *pthr,
    LPSECURITY_ATTRIBUTES lpMutexAttributes,
    BOOL bInitialOwner,
    LPCWSTR lpName,
    HANDLE *phMutex
    )
{
    CObjectAttributes oa(lpName, lpMutexAttributes);
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjMutex = NULL;
    IPalObject *pobjRegisteredMutex = NULL;
    ISynchStateController *pssc = NULL;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != phMutex);

    ENTRY("InternalCreateMutex(pthr=%p, lpMutexAttributes=%p, bInitialOwner=%d"
        ", lpName=%p, phMutex=%p)\n",
        pthr,
        lpMutexAttributes,
        bInitialOwner,
        lpName,
        phMutex
        );

    if (lpName != nullptr)
    {
        ASSERT("lpName: Cross-process named objects are not supported in PAL");
        palError = ERROR_NOT_SUPPORTED;
        goto InternalCreateMutexExit;
    }

    palError = g_pObjectManager->AllocateObject(
        pthr,
        &otMutex,
        &oa,
        &pobjMutex
        );

    if (NO_ERROR != palError)
    {
        goto InternalCreateMutexExit;
    }

    palError = pobjMutex->GetSynchStateController(
        pthr,
        &pssc
        );

    if (NO_ERROR != palError)
    {
        ASSERT("Unable to create state controller (%d)\n", palError);
        goto InternalCreateMutexExit;
    }

    if (bInitialOwner)
    {
        palError = pssc->SetOwner(pthr);
    }
    else
    {
        palError = pssc->SetSignalCount(1);
    }

    pssc->ReleaseController();

    if (NO_ERROR != palError)
    {
        ASSERT("Unable to set initial mutex state (%d)\n", palError);
        goto InternalCreateMutexExit;
    }

    palError = g_pObjectManager->RegisterObject(
        pthr,
        pobjMutex,
        &aotMutex,
        0, // should be MUTEX_ALL_ACCESS -- currently ignored (no Win32 security)
        phMutex,
        &pobjRegisteredMutex
        );

    //
    // pobjMutex is invalidated by the call to RegisterObject, so NULL it
    // out here to ensure that we don't try to release a reference on
    // it down the line.
    //

    pobjMutex = NULL;

InternalCreateMutexExit:

    if (NULL != pobjMutex)
    {
        pobjMutex->ReleaseReference(pthr);
    }

    if (NULL != pobjRegisteredMutex)
    {
        pobjRegisteredMutex->ReleaseReference(pthr);
    }

    LOGEXIT("InternalCreateMutex returns %i\n", palError);

    return palError;
}